

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O2

Amap_Item_t * Amap_LibertyCellArea(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  int iVar1;
  Amap_Item_t *pAVar2;
  int *piVar3;
  
  piVar3 = &pCell->Child;
  while( true ) {
    pAVar2 = Amap_LibertyItem(p,*piVar3);
    if (pAVar2 == (Amap_Item_t *)0x0) {
      return (Amap_Item_t *)0x0;
    }
    iVar1 = Amap_LibertyCompare(p,pAVar2->Key,"area");
    if (iVar1 == 0) break;
    piVar3 = &pAVar2->Next;
  }
  return pAVar2;
}

Assistant:

Amap_Item_t * Amap_LibertyCellArea( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pArea;
    Amap_ItemForEachChild( p, pCell, pArea )
    {
        if ( Amap_LibertyCompare(p, pArea->Key, "area") )
            continue;
        return pArea;
    }
    return NULL;
}